

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

Int __thiscall Json::Value::asInt(Value *this)

{
  double dVar1;
  byte bVar2;
  bool bVar3;
  undefined8 extraout_RAX;
  ostringstream oss;
  string local_1a0;
  Value local_180 [2];
  ios_base local_110 [264];
  
  bVar2 = this->field_0x8;
  switch(bVar2) {
  case 1:
    bVar3 = isInt(this);
    if (bVar3) {
LAB_00124a5c:
      return *(Int *)&this->value_;
    }
    this = local_180;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"LargestInt out of Int range",0x1b);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
  case 5:
    bVar2 = (this->value_).bool_;
  case 0:
    return (uint)bVar2;
  case 2:
    bVar3 = isInt(this);
    if (bVar3) goto LAB_00124a5c;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_180,"LargestUInt out of Int range",0x1c);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
    break;
  case 3:
    dVar1 = (this->value_).real_;
    if ((-2147483648.0 <= dVar1) && (dVar1 <= 2147483647.0)) {
      return (int)dVar1;
    }
    break;
  default:
    goto switchD_00124a03_caseD_4;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_180);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_180,"double out of Int range",0x17);
  std::__cxx11::stringbuf::str();
  throwLogicError(&local_1a0);
switchD_00124a03_caseD_4:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_180);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_180,"Value is not convertible to Int.",0x20);
  std::__cxx11::stringbuf::str();
  throwLogicError(&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_180);
  std::ios_base::~ios_base(local_110);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Value::Int Value::asInt() const {
  switch (type_) {
  case intValue:
    JSON_ASSERT_MESSAGE(isInt(), "LargestInt out of Int range");
    return Int(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isInt(), "LargestUInt out of Int range");
    return Int(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, minInt, maxInt),
                        "double out of Int range");
    return Int(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to Int.");
}